

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O2

Gia_Man_t * Abc_NtkTestTimDeriveGia(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Gia_Man_t *pGVar5;
  Gia_Man_t *p;
  Tim_Man_t *pTVar6;
  void *pvVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar9;
  Vec_Flt_t *vInArrs;
  Vec_Flt_t *vOutReqs;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  int local_64;
  
  iVar2 = Abc_NtkIsTopo(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsTopo(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x11a,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  Abc_NtkFillTemp(pNtk);
  iVar2 = pNtk->vCis->nSize;
  iVar12 = pNtk->vCos->nSize;
  uVar10 = 0;
  for (uVar13 = 0; iVar14 = pNtk->vObjs->nSize, (int)uVar13 < iVar14; uVar13 = uVar13 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,uVar13);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      uVar11 = 0;
      if (((uint)pAVar4->Id % 200 == 0) && (uVar1 = (pAVar4->vFanins).nSize, 0 < (int)uVar1)) {
        uVar11 = (uint)(uVar1 < 10);
      }
      *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffe7 | uVar11 << 4;
      if (uVar11 != 0) {
        uVar11 = (pAVar4->vFanins).nSize;
        if ((int)uVar10 <= (int)uVar11) {
          uVar10 = uVar11;
        }
        iVar2 = iVar2 + 1;
        iVar12 = iVar12 + uVar11;
        if (fVerbose != 0) {
          printf("Selecting node %6d as white boxes with %d inputs and %d output.\n",(ulong)uVar13,
                 (ulong)uVar11,1);
        }
      }
    }
  }
  pGVar5 = Gia_ManStart(iVar14);
  p = Gia_ManStart(1000);
  iVar14 = 0;
  if (0 < iVar2) {
    iVar14 = iVar2;
  }
  while (bVar16 = iVar14 != 0, iVar14 = iVar14 + -1, bVar16) {
    Gia_ManAppendCi(pGVar5);
  }
  uVar13 = 0;
  if (0 < (int)uVar10) {
    uVar13 = uVar10;
  }
  while (bVar16 = uVar13 != 0, uVar13 = uVar13 - 1, bVar16) {
    Gia_ManAppendCi(p);
  }
  Gia_ManHashAlloc(pGVar5);
  Gia_ManHashAlloc(p);
  pTVar6 = Tim_ManStart(iVar2,iVar12);
  for (iVar2 = 0; iVar2 < pNtk->vCis->nSize; iVar2 = iVar2 + 1) {
    pvVar7 = Vec_PtrEntry(pNtk->vCis,iVar2);
    pGVar8 = Gia_ManCi(pGVar5,iVar2);
    iVar12 = Gia_ObjId(pGVar5,pGVar8);
    iVar12 = Abc_Var2Lit(iVar12,(int)pGVar8);
    *(int *)((long)pvVar7 + 0x40) = iVar12;
  }
  p_00 = Vec_IntAlloc(1000);
  p_01 = Vec_IntAlloc(1000);
  local_64 = 0;
  for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar12);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      if ((*(uint *)&pAVar4->field_0x14 & 0x10) == 0) {
        iVar14 = Abc_NtkTestTimNodeStrash(pGVar5,pAVar4);
        (pAVar4->field_6).iTemp = iVar14;
      }
      else {
        iVar14 = (pAVar4->vFanins).nSize;
        Tim_ManCreateBox(pTVar6,local_64,iVar14,iVar2,1,iVar14,0);
        iVar14 = (pAVar4->vFanins).nSize;
        iVar3 = iVar14;
        for (lVar15 = 0; lVar15 < iVar3; lVar15 = lVar15 + 1) {
          pvVar7 = pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar15]];
          Vec_IntPush(p_00,*(int *)((long)pvVar7 + 0x40));
          pGVar8 = Gia_ManCi(p,(int)lVar15);
          iVar3 = Gia_ObjId(p,pGVar8);
          iVar3 = Abc_Var2Lit(iVar3,(int)pGVar8);
          *(int *)((long)pvVar7 + 0x40) = iVar3;
          iVar3 = (pAVar4->vFanins).nSize;
        }
        local_64 = local_64 + iVar14;
        iVar14 = Abc_NtkTestTimNodeStrash(p,pAVar4);
        (pAVar4->field_6).iTemp = iVar14;
        Vec_IntPush(p_01,iVar14);
        pGVar8 = Gia_ManCi(pGVar5,iVar2);
        iVar14 = Gia_ObjId(pGVar5,pGVar8);
        iVar14 = Abc_Var2Lit(iVar14,(int)pGVar8);
        (pAVar4->field_6).iTemp = iVar14;
        iVar2 = iVar2 + 1;
      }
    }
  }
  Abc_NtkCleanMarkA(pNtk);
  for (iVar12 = 0; iVar12 < pNtk->vCos->nSize; iVar12 = iVar12 + 1) {
    pAVar4 = Abc_NtkCo(pNtk,iVar12);
    Gia_ManAppendCo(pGVar5,*(int *)((long)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray] +
                                   0x40));
  }
  iVar12 = p_00->nSize;
  iVar14 = 0;
  if (iVar12 < 1) {
    iVar12 = 0;
    iVar14 = 0;
  }
  for (; iVar12 != iVar14; iVar14 = iVar14 + 1) {
    iVar3 = Vec_IntEntry(p_00,iVar14);
    Gia_ManAppendCo(pGVar5,iVar3);
  }
  Vec_IntFree(p_00);
  iVar14 = 0;
  iVar12 = p_01->nSize;
  if (p_01->nSize < 1) {
    iVar12 = iVar14;
  }
  for (; iVar12 != iVar14; iVar14 = iVar14 + 1) {
    iVar3 = Vec_IntEntry(p_01,iVar14);
    Gia_ManAppendCo(p,iVar3);
  }
  Vec_IntFree(p_01);
  if (iVar2 != pGVar5->vCis->nSize - pGVar5->nRegs) {
    __assert_fail("curPi == Gia_ManPiNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x16d,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  if (local_64 + pNtk->vPos->nSize != pGVar5->vCos->nSize - pGVar5->nRegs) {
    __assert_fail("curPo == Gia_ManPoNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x16e,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  Gia_ManHashStop(pGVar5);
  Gia_ManSetRegNum(pGVar5,0);
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar9 = Gia_ManCleanup(pGVar5);
  Gia_ManStop(pGVar5);
  pGVar5 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  if (pGVar9->pManTime != (void *)0x0) {
    __assert_fail("pGia->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x17c,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  pGVar9->pManTime = pTVar6;
  vInArrs = Abc_NtkTestCreateArrivals(pNtk->vPis->nSize);
  vOutReqs = Abc_NtkTestCreateRequired(pNtk->vPos->nSize);
  Tim_ManPrint((Tim_Man_t *)pGVar9->pManTime);
  pTVar6 = (Tim_Man_t *)pGVar9->pManTime;
  pvVar7 = Abc_FrameReadLibBox();
  Tim_ManCreate(pTVar6,pvVar7,vInArrs,vOutReqs);
  Tim_ManPrint((Tim_Man_t *)pGVar9->pManTime);
  Vec_FltFree(vInArrs);
  Vec_FltFree(vOutReqs);
  Gia_AigerWrite(pGVar5,"holes00.aig",0,0);
  pGVar9->pAigExtra = pGVar5;
  return pGVar9;
}

Assistant:

Gia_Man_t * Abc_NtkTestTimDeriveGia( Abc_Ntk_t * pNtk, int fVerbose )
{
    Gia_Man_t * pTemp;
    Gia_Man_t * pGia = NULL;
    Gia_Man_t * pHoles = NULL;
    Tim_Man_t * pTim = NULL;
    Vec_Int_t * vGiaCoLits, * vGiaCoLits2;
    Vec_Flt_t * vArrTimes, * vReqTimes;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Entry, curPi, curPo, BoxUniqueId;
    int nBoxFaninMax = 0;
    assert( Abc_NtkIsTopo(pNtk) );
    Abc_NtkFillTemp( pNtk );

    // create white boxes
    curPi = Abc_NtkCiNum(pNtk);
    curPo = Abc_NtkCoNum(pNtk);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->fMarkA = Abc_NodeIsWhiteBox( pObj );
        if ( !pObj->fMarkA )
            continue;
        nBoxFaninMax  = Abc_MaxInt( nBoxFaninMax, Abc_ObjFaninNum(pObj) );
        curPi++;
        curPo += Abc_ObjFaninNum(pObj);
        if ( fVerbose )
            printf( "Selecting node %6d as white boxes with %d inputs and %d output.\n", i, Abc_ObjFaninNum(pObj), 1 );
    }

    // construct GIA
    pGia = Gia_ManStart( Abc_NtkObjNumMax(pNtk) );
    pHoles = Gia_ManStart( 1000 );
    for ( i = 0; i < curPi; i++ )
        Gia_ManAppendCi(pGia);
    for ( i = 0; i < nBoxFaninMax; i++ )
        Gia_ManAppendCi(pHoles);
    Gia_ManHashAlloc( pGia );
    Gia_ManHashAlloc( pHoles );

    // construct the timing manager
    pTim = Tim_ManStart( curPi, curPo );

    // assign primary inputs
    curPi = 0;
    curPo = 0;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManCi(pGia, curPi++)), 0 );
    // create internal nodes in a topologic order from white boxes
    vGiaCoLits = Vec_IntAlloc( 1000 );
    vGiaCoLits2 = Vec_IntAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !pObj->fMarkA ) // not a white box
        {
            pObj->iTemp = Abc_NtkTestTimNodeStrash( pGia, pObj );
            continue;
        }
        // create box
        BoxUniqueId = Abc_ObjFaninNum(pObj); // in this case, the node size is the ID of its delay table
        Tim_ManCreateBox( pTim, curPo, Abc_ObjFaninNum(pObj), curPi, 1, BoxUniqueId, 0 );
        curPo += Abc_ObjFaninNum(pObj);

        // handle box inputs
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            // save CO drivers for the AIG
            Vec_IntPush( vGiaCoLits, pFanin->iTemp );
            // load CI nodes for the Holes
            pFanin->iTemp = Abc_Var2Lit( Gia_ObjId(pHoles, Gia_ManCi(pHoles, k)), 0 );
        }

        // handle logic of the box
        pObj->iTemp = Abc_NtkTestTimNodeStrash( pHoles, pObj );

        // handle box outputs
        // save CO drivers for the Holes
        Vec_IntPush( vGiaCoLits2, pObj->iTemp );
//        Gia_ManAppendCo( pHoles, pObj->iTemp );
        // load CO drivers for the AIG
        pObj->iTemp = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManCi(pGia, curPi++)), 0 );
    }
    Abc_NtkCleanMarkA( pNtk );
    // create COs of the AIG
    Abc_NtkForEachCo( pNtk, pObj, i )
        Gia_ManAppendCo( pGia, Abc_ObjFanin0(pObj)->iTemp );
    Vec_IntForEachEntry( vGiaCoLits, Entry, i )
        Gia_ManAppendCo( pGia, Entry );
    Vec_IntFree( vGiaCoLits );
    // second AIG
    Vec_IntForEachEntry( vGiaCoLits2, Entry, i )
        Gia_ManAppendCo( pHoles, Entry );
    Vec_IntFree( vGiaCoLits2 );
    // check parameters
    curPo += Abc_NtkPoNum( pNtk );
    assert( curPi == Gia_ManPiNum(pGia) );
    assert( curPo == Gia_ManPoNum(pGia) );
    // finalize GIA
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    Gia_ManHashStop( pHoles );
    Gia_ManSetRegNum( pHoles, 0 );

    // clean up GIA
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    pHoles = Gia_ManCleanup( pTemp = pHoles );
    Gia_ManStop( pTemp );

    // attach the timing manager
    assert( pGia->pManTime == NULL );
    pGia->pManTime = pTim;

    // derive hierarchy manager from box info and input/output arrival/required info
    vArrTimes = Abc_NtkTestCreateArrivals( Abc_NtkPiNum(pNtk) );
    vReqTimes = Abc_NtkTestCreateRequired( Abc_NtkPoNum(pNtk) );

    Tim_ManPrint( (Tim_Man_t *)pGia->pManTime );
    Tim_ManCreate( (Tim_Man_t *)pGia->pManTime, Abc_FrameReadLibBox(), vArrTimes, vReqTimes );
    Tim_ManPrint( (Tim_Man_t *)pGia->pManTime );

    Vec_FltFree( vArrTimes );
    Vec_FltFree( vReqTimes );

Gia_AigerWrite( pHoles, "holes00.aig", 0, 0 );

    // return 
    pGia->pAigExtra = pHoles;
    return pGia;
}